

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFS.h
# Opt level: O2

bool dg::pta::PointerAnalysisFS::mergeObjects
               (PSNode *node,MemoryObject *to,MemoryObject *from,PointsToSetT *overwritten)

{
  bool bVar1;
  size_t sVar2;
  mapped_type *this;
  _Base_ptr p_Var3;
  bool bVar4;
  const_iterator __begin3;
  const_iterator local_58;
  Pointer local_40;
  
  p_Var3 = (from->pointsTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar4 = false;
  do {
    if ((_Rb_tree_header *)p_Var3 == &(from->pointsTo)._M_t._M_impl.super__Rb_tree_header) {
      return bVar4;
    }
    if (overwritten == (PointsToSetT *)0x0) {
LAB_0012a93c:
      this = std::
             map<dg::Offset,_dg::pta::PointerIdPointsToSet,_std::less<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>_>
             ::operator[](&to->pointsTo,(key_type *)(p_Var3 + 1));
      ADT::
      SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
      ::begin(&local_58,
              (SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
               *)&p_Var3[1]._M_parent);
      while ((local_58.pos != 0 ||
             (local_58.container_it.
              super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur
              != (__node_type *)0x0))) {
        local_40 = PointerIdPointsToSet::const_iterator::operator*((const_iterator *)&local_58);
        bVar1 = PointerIdPointsToSet::add(this,&local_40);
        bVar4 = (bool)(bVar4 | bVar1);
        ADT::
        SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
        ::const_iterator::operator++(&local_58);
      }
    }
    else {
      local_58.container_end.
      super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
           *(_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> *)
            (p_Var3 + 1);
      local_58.container_it.
      super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
           (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
           (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)node;
      sVar2 = PointerIdPointsToSet::count(overwritten,(Pointer *)&local_58);
      if (sVar2 == 0) goto LAB_0012a93c;
    }
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
  } while( true );
}

Assistant:

static bool mergeObjects(PSNode *node, MemoryObject *to, MemoryObject *from,
                             PointsToSetT *overwritten) {
        bool changed = false;

        for (auto &fromIt : from->pointsTo) {
            if (overwritten && overwritten->count(Pointer(node, fromIt.first)))
                continue;

            auto &S = to->pointsTo[fromIt.first];
            for (const auto &ptr : fromIt.second)
                changed |= S.add(ptr);
        }

        return changed;
    }